

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

size_t pull_varlength(uchar **cursor,size_t *max)

{
  size_t sVar1;
  
  sVar1 = pull_varint(cursor,max);
  if (*max < sVar1) {
    sVar1 = 0;
    *cursor = (uchar *)0x0;
    *max = 0;
  }
  return sVar1;
}

Assistant:

size_t pull_varlength(const unsigned char **cursor, size_t *max)
{
    uint64_t len = pull_varint(cursor, max);

    if (len > *max) {
        /* Impossible length. */
        pull_failed(cursor, max);
        return 0;
    }
    return len;
}